

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryfusefilter.h
# Opt level: O3

_Bool binary_fuse8_populate(uint64_t *keys,uint32_t size,binary_fuse8_t *filter)

{
  ulong *puVar1;
  ulong uVar2;
  uint8_t *puVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int iVar8;
  bool bVar9;
  int iVar10;
  void *__s;
  void *__s_00;
  void *__s_01;
  void *__ptr;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  _Bool _Var14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  int iVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  byte bVar24;
  int iVar25;
  uint uVar26;
  byte bVar27;
  byte bVar28;
  ulong uVar29;
  uint uVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  uint32_t h012 [5];
  ulong local_f8;
  ulong local_e8;
  uint local_d8 [4];
  uint local_c8;
  void *local_b8;
  void *local_b0;
  ulong local_a8;
  uint64_t *local_a0;
  ulong local_98;
  int local_8c;
  size_t local_88;
  ulong local_80;
  binary_fuse8_t *local_78;
  ulong local_70;
  void *local_68;
  ulong local_60;
  long local_58;
  ulong local_50;
  undefined1 local_48 [16];
  
  if (filter->Size != size) {
    return false;
  }
  local_f8 = (ulong)size;
  uVar29 = 0x6df6b22537d23467;
  filter->Seed = 0x6df6b22537d23467;
  local_a0 = keys;
  __s = calloc((ulong)(size + 1),8);
  uVar15 = filter->ArrayLength;
  uVar23 = (ulong)uVar15;
  local_b0 = malloc(uVar23 * 4);
  __s_00 = calloc(uVar23,1);
  local_b8 = malloc(local_f8);
  __s_01 = calloc(uVar23,8);
  local_a8 = 0xffffffc0;
  do {
    uVar30 = 1 << ((char)local_a8 + 0x41U & 0x1f);
    local_a8 = (ulong)((int)local_a8 + 1);
  } while (uVar30 < filter->SegmentCount);
  local_98 = (ulong)uVar30;
  __ptr = malloc(local_98 * 4);
  auVar32._0_4_ = -(uint)((int)((ulong)local_b0 >> 0x20) == 0 && (int)local_b0 == 0);
  auVar32._4_4_ = -(uint)((int)__s_00 == 0 && (int)((ulong)__s_00 >> 0x20) == 0);
  auVar32._8_4_ = -(uint)((int)((ulong)local_b8 >> 0x20) == 0 && (int)local_b8 == 0);
  auVar32._12_4_ = -(uint)((int)__s_01 == 0 && (int)((ulong)__s_01 >> 0x20) == 0);
  iVar10 = movmskps((int)__ptr,auVar32);
  _Var14 = false;
  if (((iVar10 == 0) && (_Var14 = false, __s != (void *)0x0)) &&
     (_Var14 = false, __ptr != (void *)0x0)) {
    iVar10 = (int)local_a8;
    *(undefined8 *)((long)__s + local_f8 * 8) = 1;
    local_88 = uVar23 * 8;
    lVar11 = local_98 - 1;
    auVar33._8_4_ = (int)lVar11;
    auVar33._0_8_ = lVar11;
    auVar33._12_4_ = (int)((ulong)lVar11 >> 0x20);
    uVar17 = 0x10a2a556c2d61962;
    iVar20 = 1;
    local_a8 = (ulong)(uint)-iVar10;
    local_8c = iVar10 + 0x40;
    local_70 = local_98 + 1 & 0xfffffffffffffffe;
    local_48 = auVar33 ^ _DAT_00109070;
    local_78 = filter;
    local_68 = __s;
    do {
      auVar32 = _DAT_00109070;
      local_80 = uVar17;
      iVar10 = (int)local_f8;
      uVar16 = 0;
      uVar17 = 0;
      auVar31 = _DAT_00109060;
      do {
        auVar33 = auVar31 ^ auVar32;
        if ((bool)(~(auVar33._4_4_ == local_48._4_4_ && local_48._0_4_ < auVar33._0_4_ ||
                    local_48._4_4_ < auVar33._4_4_) & 1)) {
          *(uint *)((long)__ptr + uVar17 * 4) = uVar16 >> ((byte)local_8c & 0x1f);
        }
        if ((auVar33._12_4_ != local_48._12_4_ || auVar33._8_4_ <= local_48._8_4_) &&
            auVar33._12_4_ <= local_48._12_4_) {
          *(uint *)((long)__ptr + uVar17 * 4 + 4) = iVar10 + uVar16 >> ((byte)local_8c & 0x1f);
        }
        uVar17 = uVar17 + 2;
        lVar11 = auVar31._8_8_;
        auVar31._0_8_ = auVar31._0_8_ + 2;
        auVar31._8_8_ = lVar11 + 2;
        uVar16 = uVar16 + iVar10 * 2;
      } while (local_70 != uVar17);
      local_e8 = 0;
      uVar17 = local_f8 & 0xffffffff;
      iVar25 = 0;
      if (iVar10 == 0) {
LAB_00102eb4:
        if (uVar15 != 0) {
          uVar29 = 0;
          uVar12 = 0;
          do {
            *(int *)((long)local_b0 + uVar12 * 4) = (int)uVar29;
            uVar16 = (uint)((*(byte *)((long)__s_00 + uVar29) & 0xfc) == 4) + (int)uVar12;
            uVar12 = (ulong)uVar16;
            uVar29 = uVar29 + 1;
          } while (uVar23 != uVar29);
          if (uVar16 == 0) {
            local_e8 = 0;
          }
          else {
            local_e8 = 0;
            do {
              uVar16 = (int)uVar12 - 1;
              uVar12 = (ulong)uVar16;
              uVar29 = (ulong)*(uint *)((long)local_b0 + uVar12 * 4);
              bVar24 = *(byte *)((long)__s_00 + uVar29);
              if ((bVar24 & 0xfc) == 4) {
                uVar29 = *(ulong *)((long)__s_01 + uVar29 * 8);
                auVar6._8_8_ = 0;
                auVar6._0_8_ = uVar29;
                local_d8[3] = SUB164(ZEXT416(filter->SegmentCountLength) * auVar6,8);
                local_d8[1] = (uint)(uVar29 >> 0x12) & filter->SegmentLengthMask & 0x3ffff ^
                              local_d8[3] + filter->SegmentLength;
                local_d8[2] = filter->SegmentLengthMask & (uint)uVar29 ^
                              local_d8[3] + filter->SegmentLength * 2;
                local_c8 = local_d8[1];
                uVar26 = bVar24 & 3;
                uVar18 = (ulong)local_d8[(ulong)uVar26 + 1];
                bVar24 = *(byte *)((long)__s_00 + uVar18);
                bVar28 = (byte)uVar26;
                *(uint *)((long)local_b0 + uVar12 * 4) = local_d8[(ulong)uVar26 + 1];
                uVar16 = uVar16 + ((bVar24 & 0xfc) == 8);
                bVar27 = bVar28 - 2;
                if (bVar28 < 2) {
                  bVar27 = bVar28 + 1;
                }
                *(byte *)((long)local_b8 + local_e8) = bVar28;
                *(ulong *)((long)__s + local_e8 * 8) = uVar29;
                puVar1 = (ulong *)((long)__s_01 + uVar18 * 8);
                *puVar1 = *puVar1 ^ uVar29;
                *(byte *)((long)__s_00 + uVar18) = bVar27 ^ bVar24 - 4;
                uVar12 = (ulong)local_d8[uVar26 + 2];
                bVar24 = *(byte *)((long)__s_00 + uVar12);
                *(uint *)((long)local_b0 + (ulong)uVar16 * 4) = local_d8[uVar26 + 2];
                bVar28 = (char)(uVar26 + 2) - 3;
                if ((ulong)uVar26 == 0) {
                  bVar28 = 2;
                }
                *(byte *)((long)__s_00 + uVar12) = bVar28 ^ bVar24 - 4;
                puVar1 = (ulong *)((long)__s_01 + uVar12 * 8);
                *puVar1 = *puVar1 ^ uVar29;
                uVar12 = (ulong)(((bVar24 & 0xfc) == 8) + uVar16);
                local_e8 = (ulong)((int)local_e8 + 1);
              }
            } while ((int)uVar12 != 0);
          }
        }
        uVar16 = (uint)local_e8;
        if (uVar16 + iVar25 == iVar10) {
          _Var14 = true;
          if (uVar16 != 0) {
            uVar15 = uVar16 - 1;
            do {
              uVar29 = *(ulong *)((long)__s + (ulong)uVar15 * 8);
              uVar23 = (ulong)*(byte *)((long)local_b8 + (ulong)uVar15);
              auVar7._8_8_ = 0;
              auVar7._0_8_ = uVar29;
              local_d8[0] = SUB164(ZEXT416(filter->SegmentCountLength) * auVar7,8);
              local_d8[1] = (uint)(uVar29 >> 0x12) & filter->SegmentLengthMask & 0x3ffff ^
                            local_d8[0] + filter->SegmentLength;
              local_d8[2] = filter->SegmentLengthMask & (uint)uVar29 ^
                            local_d8[0] + filter->SegmentLength * 2;
              local_d8[3] = local_d8[0];
              local_c8 = local_d8[1];
              puVar3 = filter->Fingerprints;
              puVar3[local_d8[uVar23]] =
                   (byte)(uVar29 >> 0x20) ^ (byte)uVar29 ^ puVar3[local_d8[uVar23 + 1]] ^
                   puVar3[local_d8[uVar23 + 2]];
              uVar15 = uVar15 - 1;
            } while (uVar15 < uVar16);
            _Var14 = true;
          }
          goto LAB_001031f0;
        }
        if (iVar25 != 0) {
          local_f8 = binary_fuse_sort_and_remove_dup(local_a0,uVar17);
        }
        uVar17 = local_f8 & 0xffffffff;
      }
      else {
        uVar12 = 0;
        do {
          uVar18 = (local_a0[uVar12] + uVar29 >> 0x21 ^ local_a0[uVar12] + uVar29) *
                   -0xae502812aa7333;
          uVar18 = (uVar18 >> 0x21 ^ uVar18) * -0x3b314601e57a13ad;
          uVar18 = uVar18 >> 0x21 ^ uVar18;
          uVar21 = uVar18 >> ((byte)local_a8 & 0x3f);
          while( true ) {
            uVar16 = *(uint *)((long)__ptr + uVar21 * 4);
            if (*(long *)((long)__s + (ulong)uVar16 * 8) == 0) break;
            uVar21 = (ulong)((int)uVar21 + 1U & uVar30 - 1);
          }
          *(ulong *)((long)__s + (ulong)uVar16 * 8) = uVar18;
          *(uint *)((long)__ptr + uVar21 * 4) = uVar16 + 1;
          uVar12 = uVar12 + 1;
        } while (uVar12 != uVar17);
        iVar25 = 0;
        if (iVar10 == 0) goto LAB_00102eb4;
        uVar16 = filter->SegmentLength;
        uVar26 = filter->SegmentLengthMask;
        local_50 = (ulong)uVar26;
        local_98 = (ulong)uVar16;
        local_58 = (ulong)uVar16 * 2;
        uVar29 = 0;
        local_60 = CONCAT44(0,filter->SegmentCountLength);
        bVar9 = false;
        iVar25 = 0;
        do {
          uVar12 = *(ulong *)((long)__s + uVar29 * 8);
          auVar4._8_8_ = 0;
          auVar4._0_8_ = local_60;
          auVar5._8_8_ = 0;
          auVar5._0_8_ = uVar12;
          lVar11 = SUB168(auVar4 * auVar5,8);
          *(char *)((long)__s_00 + lVar11) = *(char *)((long)__s_00 + lVar11) + '\x04';
          puVar1 = (ulong *)((long)__s_01 + lVar11 * 8);
          *puVar1 = *puVar1 ^ uVar12;
          iVar8 = SUB164(auVar4 * auVar5,8);
          uVar13 = (ulong)((uint)(uVar12 >> 0x12) & uVar26 & 0x3ffff ^ iVar8 + uVar16);
          *(byte *)((long)__s_00 + uVar13) = (*(byte *)((long)__s_00 + uVar13) ^ 1) + 4;
          puVar1 = (ulong *)((long)__s_01 + uVar13 * 8);
          *puVar1 = *puVar1 ^ uVar12;
          uVar22 = (ulong)((uint)uVar12 & uVar26 ^ (int)local_58 + iVar8);
          bVar24 = *(char *)((long)__s_00 + uVar22) + 4;
          uVar18 = *(ulong *)((long)__s_01 + uVar22 * 8);
          uVar19 = uVar18 ^ uVar12;
          *(ulong *)((long)__s_01 + uVar22 * 8) = uVar19;
          bVar28 = bVar24 ^ 2;
          *(byte *)((long)__s_00 + uVar22) = bVar28;
          uVar21 = *(ulong *)((long)__s_01 + lVar11 * 8);
          uVar2 = *(ulong *)((long)__s_01 + uVar13 * 8);
          if (((uVar19 & uVar21 & uVar2) == 0) &&
             ((((uVar21 == 0 && (*(char *)((long)__s_00 + lVar11) == '\b')) ||
               ((uVar2 == 0 && (*(char *)((long)__s_00 + uVar13) == '\b')))) ||
              ((uVar18 == uVar12 && (bVar24 == 10)))))) {
            iVar25 = iVar25 + 1;
            *(char *)((long)__s_00 + lVar11) = *(char *)((long)__s_00 + lVar11) + -4;
            *(ulong *)((long)__s_01 + lVar11 * 8) = uVar21 ^ uVar12;
            bVar24 = *(byte *)((long)__s_00 + uVar13);
            puVar1 = (ulong *)((long)__s_01 + uVar13 * 8);
            *puVar1 = *puVar1 ^ uVar12;
            *(byte *)((long)__s_00 + uVar13) = (bVar24 ^ 1) - 4;
            bVar28 = (*(byte *)((long)__s_00 + uVar22) ^ 2) - 4;
            *(byte *)((long)__s_00 + uVar22) = bVar28;
            puVar1 = (ulong *)((long)__s_01 + uVar22 * 8);
            *puVar1 = *puVar1 ^ uVar12;
          }
          if (*(byte *)((long)__s_00 + lVar11) < 4) {
            bVar9 = true;
          }
          if (*(byte *)((long)__s_00 + uVar13) < 4) {
            bVar9 = true;
          }
          if (bVar28 < 4) {
            bVar9 = true;
          }
          uVar29 = uVar29 + 1;
          __s = local_68;
        } while (uVar17 != uVar29);
        filter = local_78;
        if (!bVar9) goto LAB_00102eb4;
      }
      memset(__s,0,uVar17 << 3);
      memset(__s_00,0,uVar23);
      memset(__s_01,0,local_88);
      uVar17 = local_80 + 0x9e3779b97f4a7c15;
      uVar29 = (uVar17 >> 0x1e ^ uVar17) * -0x40a7b892e31b1a47;
      uVar29 = (uVar29 >> 0x1b ^ uVar29) * -0x6b2fb644ecceee15;
      uVar29 = uVar29 >> 0x1f ^ uVar29;
      filter->Seed = uVar29;
      iVar20 = iVar20 + 1;
    } while (iVar20 != 0x65);
    memset(filter->Fingerprints,0xff,(ulong)filter->ArrayLength);
    _Var14 = false;
  }
LAB_001031f0:
  free(local_b0);
  free(__s_00);
  free(local_b8);
  free(__s_01);
  free(__s);
  free(__ptr);
  return _Var14;
}

Assistant:

static inline bool binary_fuse8_populate(uint64_t *keys, uint32_t size,
                           binary_fuse8_t *filter) {
  if (size != filter->Size) {
    return false;
  }

  uint64_t rng_counter = 0x726b2b9d438b9d4d;
  filter->Seed = binary_fuse_rng_splitmix64(&rng_counter);
  uint64_t *reverseOrder = (uint64_t *)calloc((size + 1), sizeof(uint64_t));
  uint32_t capacity = filter->ArrayLength;
  uint32_t *alone = (uint32_t *)malloc(capacity * sizeof(uint32_t));
  uint8_t *t2count = (uint8_t *)calloc(capacity, sizeof(uint8_t));
  uint8_t *reverseH = (uint8_t *)malloc(size * sizeof(uint8_t));
  uint64_t *t2hash = (uint64_t *)calloc(capacity, sizeof(uint64_t));

  uint32_t blockBits = 1;
  while (((uint32_t)1 << blockBits) < filter->SegmentCount) {
    blockBits += 1;
  }
  uint32_t block = ((uint32_t)1 << blockBits);
  uint32_t *startPos = (uint32_t *)malloc((1U << blockBits) * sizeof(uint32_t));
  uint32_t h012[5];

  if ((alone == NULL) || (t2count == NULL) || (reverseH == NULL) ||
      (t2hash == NULL) || (reverseOrder == NULL) || (startPos == NULL)) {
    free(alone);
    free(t2count);
    free(reverseH);
    free(t2hash);
    free(reverseOrder);
    free(startPos);
    return false;
  }
  reverseOrder[size] = 1;
  for (int loop = 0; true; ++loop) {
    if (loop + 1 > XOR_MAX_ITERATIONS) {
      // The probability of this happening is lower than the
      // the cosmic-ray probability (i.e., a cosmic ray corrupts your system)
      memset(filter->Fingerprints, 0xFF, filter->ArrayLength);
      free(alone);
      free(t2count);
      free(reverseH);
      free(t2hash);
      free(reverseOrder);
      free(startPos);
      return false;
    }

    for (uint32_t i = 0; i < block; i++) {
      // important : i * size would overflow as a 32-bit number in some
      // cases.
      startPos[i] = (uint32_t)((uint64_t)i * size) >> blockBits;
    }

    uint64_t maskblock = block - 1;
    for (uint32_t i = 0; i < size; i++) {
      uint64_t hash = binary_fuse_murmur64(keys[i] + filter->Seed);
      uint64_t segment_index = hash >> (64 - blockBits);
      while (reverseOrder[startPos[segment_index]] != 0) {
        segment_index++;
        segment_index &= maskblock;
      }
      reverseOrder[startPos[segment_index]] = hash;
      startPos[segment_index]++;
    }
    int error = 0;
    uint32_t duplicates = 0;
    for (uint32_t i = 0; i < size; i++) {
      uint64_t hash = reverseOrder[i];
      uint32_t h0 = binary_fuse8_hash(0, hash, filter);
      t2count[h0] += 4;
      t2hash[h0] ^= hash;
      uint32_t h1= binary_fuse8_hash(1, hash, filter);
      t2count[h1] += 4;
      t2count[h1] ^= 1U;
      t2hash[h1] ^= hash;
      uint32_t h2 = binary_fuse8_hash(2, hash, filter);
      t2count[h2] += 4;
      t2hash[h2] ^= hash;
      t2count[h2] ^= 2U;
      if ((t2hash[h0] & t2hash[h1] & t2hash[h2]) == 0) {
        if   (((t2hash[h0] == 0) && (t2count[h0] == 8))
          ||  ((t2hash[h1] == 0) && (t2count[h1] == 8))
          ||  ((t2hash[h2] == 0) && (t2count[h2] == 8))) {
					duplicates += 1;
 					t2count[h0] -= 4;
 					t2hash[h0] ^= hash;
 					t2count[h1] -= 4;
 					t2count[h1] ^= 1U;
 					t2hash[h1] ^= hash;
 					t2count[h2] -= 4;
 					t2count[h2] ^= 2U;
 					t2hash[h2] ^= hash;
        }
      }
      error = (t2count[h0] < 4) ? 1 : error;
      error = (t2count[h1] < 4) ? 1 : error;
      error = (t2count[h2] < 4) ? 1 : error;
    }
    if(error) {
      memset(reverseOrder, 0, sizeof(uint64_t) * size);
      memset(t2count, 0, sizeof(uint8_t) * capacity);
      memset(t2hash, 0, sizeof(uint64_t) * capacity);
      filter->Seed = binary_fuse_rng_splitmix64(&rng_counter);
      continue;
    }

    // End of key addition
    uint32_t Qsize = 0;
    // Add sets with one key to the queue.
    for (uint32_t i = 0; i < capacity; i++) {
      alone[Qsize] = i;
      Qsize += ((t2count[i] >> 2U) == 1) ? 1U : 0U;
    }
    uint32_t stacksize = 0;
    while (Qsize > 0) {
      Qsize--;
      uint32_t index = alone[Qsize];
      if ((t2count[index] >> 2U) == 1) {
        uint64_t hash = t2hash[index];

        //h012[0] = binary_fuse8_hash(0, hash, filter);
        h012[1] = binary_fuse8_hash(1, hash, filter);
        h012[2] = binary_fuse8_hash(2, hash, filter);
        h012[3] = binary_fuse8_hash(0, hash, filter); // == h012[0];
        h012[4] = h012[1];
        uint8_t found = t2count[index] & 3U;
        reverseH[stacksize] = found;
        reverseOrder[stacksize] = hash;
        stacksize++;
        uint32_t other_index1 = h012[found + 1];
        alone[Qsize] = other_index1;
        Qsize += ((t2count[other_index1] >> 2U) == 2 ? 1U : 0U);

        t2count[other_index1] -= 4;
        t2count[other_index1] ^= binary_fuse_mod3(found + 1);
        t2hash[other_index1] ^= hash;

        uint32_t other_index2 = h012[found + 2];
        alone[Qsize] = other_index2;
        Qsize += ((t2count[other_index2] >> 2U) == 2 ? 1U : 0U);
        t2count[other_index2] -= 4;
        t2count[other_index2] ^= binary_fuse_mod3(found + 2);
        t2hash[other_index2] ^= hash;
      }
    }
    if (stacksize + duplicates == size) {
      // success
      size = stacksize;
      break;
    }
    if(duplicates > 0) {
      size = (uint32_t)binary_fuse_sort_and_remove_dup(keys, size);
    }
    memset(reverseOrder, 0, sizeof(uint64_t) * size);
    memset(t2count, 0, sizeof(uint8_t) * capacity);
    memset(t2hash, 0, sizeof(uint64_t) * capacity);
    filter->Seed = binary_fuse_rng_splitmix64(&rng_counter);
  }

  for (uint32_t i = size - 1; i < size; i--) {
    // the hash of the key we insert next
    uint64_t hash = reverseOrder[i];
    uint8_t xor2 = binary_fuse8_fingerprint(hash);
    uint8_t found = reverseH[i];
    h012[0] = binary_fuse8_hash(0, hash, filter);
    h012[1] = binary_fuse8_hash(1, hash, filter);
    h012[2] = binary_fuse8_hash(2, hash, filter);
    h012[3] = h012[0];
    h012[4] = h012[1];
    filter->Fingerprints[h012[found]] = (uint8_t)((uint32_t)xor2 ^
                                                  filter->Fingerprints[h012[found + 1]] ^
                                                  filter->Fingerprints[h012[found + 2]]);
  }
  free(alone);
  free(t2count);
  free(reverseH);
  free(t2hash);
  free(reverseOrder);
  free(startPos);
  return true;
}